

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O0

void * OPENSSL_lh_retrieve_key
                 (_LHASH *lh,void *key,uint32_t key_hash,_func_int_void_ptr_void_ptr *cmp_key)

{
  LHASH_ITEM **ppLVar1;
  void *local_38;
  LHASH_ITEM **next_ptr;
  _func_int_void_ptr_void_ptr *cmp_key_local;
  uint32_t key_hash_local;
  void *key_local;
  _LHASH *lh_local;
  
  ppLVar1 = get_next_ptr_by_key(lh,key,key_hash,cmp_key);
  if (*ppLVar1 == (LHASH_ITEM *)0x0) {
    local_38 = (void *)0x0;
  }
  else {
    local_38 = (*ppLVar1)->data;
  }
  return local_38;
}

Assistant:

void *OPENSSL_lh_retrieve_key(const _LHASH *lh, const void *key,
                              uint32_t key_hash,
                              int (*cmp_key)(const void *key,
                                             const void *value)) {
  LHASH_ITEM **next_ptr = get_next_ptr_by_key(lh, key, key_hash, cmp_key);
  return *next_ptr == NULL ? NULL : (*next_ptr)->data;
}